

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O3

Plot * plotLines<Result<unsigned_int,double>>
                 (Plot *__return_storage_ptr__,
                 vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                 *rs,function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
                     *valuesFunc,storage_t sizePercent,string *title,string *yLabel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pRVar3;
  vector<double,_std::allocator<double>_> *vecs;
  DrawSpecs *pDVar4;
  pointer pRVar5;
  ulong uVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  storage_range_t sVar7;
  Plot *p;
  valarray<double> x;
  string local_120;
  storage_t local_100;
  undefined1 local_f8 [16];
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90 [2];
  valarray<double> local_80;
  string local_70;
  _Any_data local_50;
  code *local_40;
  
  local_100 = sizePercent;
  std::
  function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
  ::function((function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
              *)&local_50,valuesFunc);
  sVar7 = calculateMedianRange<Result<unsigned_int,double>>
                    (rs,(function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
                         *)&local_50,local_100);
  local_100 = sVar7.first;
  local_f8._8_4_ = in_XMM1_Dc;
  local_f8._0_8_ = sVar7.second;
  local_f8._12_4_ = in_XMM1_Dd;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  pRVar5 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sciplot::linspace<unsigned_int,unsigned_int,double>
            ((sciplot *)&local_80,(pRVar5->inputRange).first,(pRVar5->inputRange).second,
             pRVar5->samplesInRange);
  sciplot::Plot::Plot(__return_storage_ptr__);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_a0,local_98 + (long)local_a0)
  ;
  sciplot::AxisLabelSpecs::text(&__return_storage_ptr__->m_xlabel,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_120.field_2._M_local_buf[5],
                                      CONCAT14(local_120.field_2._M_local_buf[4],
                                               local_120.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  pcVar2 = (title->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + title->_M_string_length);
  sciplot::TitleSpecsOf<sciplot::LegendSpecs>::title
            (&(__return_storage_ptr__->m_legend).super_TitleSpecsOf<sciplot::LegendSpecs>,&local_70)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  sciplot::LineSpecsOf<sciplot::BorderSpecs>::lineWidth
            (&(__return_storage_ptr__->m_border).super_LineSpecsOf<sciplot::BorderSpecs>,1);
  pcVar2 = (yLabel->_M_dataplus)._M_p;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + yLabel->_M_string_length);
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_c0,local_b8 + (long)local_c0)
  ;
  sciplot::AxisLabelSpecs::text(&__return_storage_ptr__->m_ylabel,&local_120);
  uVar6 = -(ulong)((double)local_f8._0_8_ - local_100 == 0.0);
  local_f8._0_8_ = ~uVar6 & local_f8._0_8_ | (ulong)(local_100 + 1.0) & uVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_120.field_2._M_local_buf[5],
                                      CONCAT14(local_120.field_2._M_local_buf[4],
                                               local_120.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  sciplot::Plot::yrange(__return_storage_ptr__,local_100,(double)local_f8._0_8_);
  pRVar5 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar3) {
    do {
      if ((valuesFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      vecs = (*valuesFunc->_M_invoker)((_Any_data *)valuesFunc,pRVar5);
      local_120.field_2._M_local_buf[4] = 's';
      local_120.field_2._M_allocated_capacity._0_4_ = 0x656e696c;
      local_120._M_string_length = 5;
      local_120.field_2._M_local_buf[5] = '\0';
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      pDVar4 = sciplot::Plot::
               drawWithVecs<std::valarray<double>,std::vector<double,std::allocator<double>>>
                         (__return_storage_ptr__,&local_120,&local_80,vecs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_120.field_2._M_local_buf[5],
                                          CONCAT14(local_120.field_2._M_local_buf[4],
                                                   local_120.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      pcVar2 = (pRVar5->description)._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar2,pcVar2 + (pRVar5->description)._M_string_length);
      pDVar4 = sciplot::DrawSpecs::label(pDVar4,&local_e0);
      sciplot::LineSpecsOf<sciplot::DrawSpecs>::lineWidth
                (&pDVar4->super_LineSpecsOf<sciplot::DrawSpecs>,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != pRVar3);
  }
  operator_delete(local_80._M_data);
  return __return_storage_ptr__;
}

Assistant:

sciplot::Plot plotLines(const std::vector<ResultT>& rs, std::function<const std::vector<typename ResultT::storage_t>&(const ResultT&)> valuesFunc, typename ResultT::storage_t sizePercent, const std::string& title, const std::string& yLabel)
{
    auto rangePercent = calculateMedianRange(rs, valuesFunc, sizePercent);
    rangePercent.second = rangePercent.second - rangePercent.first == 0 ? rangePercent.first + 1 : rangePercent.second;
    const auto& fr = rs.front();
    const auto x = sciplot::linspace(fr.inputRange.first, fr.inputRange.second, fr.samplesInRange);
    sciplot::Plot p;
    p.tics();
    p.xlabel("");
    p.legend().title(title);
    p.border().lineWidth(1);
    p.ylabel(yLabel);
    p.yrange(rangePercent.first, rangePercent.second);
    for (const auto& r : rs)
    {
        p.drawCurve(x, valuesFunc(r)).label(r.description).lineWidth(1);
    }
    return p;
}